

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_util::split_param
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *p,string *sep,char open_par,char close_par)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  string t;
  string symbols;
  string local_98;
  uint local_74;
  string local_70;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = local_40;
  pcVar1 = (sep->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + sep->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  uVar6 = 0;
  local_74 = (uint)close_par;
  uVar5 = 0;
  do {
    lVar3 = std::__cxx11::string::find_first_of((char *)p,(ulong)local_50,uVar5);
    uVar5 = 0xffffffffffffffff;
    if (lVar3 != -1) {
      if ((p->_M_dataplus)._M_p[lVar3] == open_par) {
        sVar4 = std::__cxx11::string::find((char)p,(ulong)local_74);
        lVar3 = sVar4 + 1;
        if (lVar3 == -1 || sVar4 == p->_M_string_length) goto LAB_0011cf1a;
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)p);
      remove_spaces(&local_98,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      uVar5 = lVar3 + 1;
      uVar6 = uVar5;
    }
LAB_0011cf1a:
    if (p->_M_string_length < uVar5) {
      if (uVar5 != uVar6) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)p);
        remove_spaces(&local_98,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar2 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

vector<string> split_param(const string &p, const string &sep,
                               char open_par, char close_par)
    {
        vector<string> temp;
        string::size_type pos = 0;
        string::size_type old_pos = 0;

        string symbols = sep + open_par;

        while (pos <= p.size()) {
            pos = p.find_first_of(symbols, pos);

            if (pos != string::npos)
                if (p[pos] == open_par) {
                    pos = p.find(close_par, pos);
                    if (pos == p.size()) pos = string::npos;
                    else ++pos;
                }

            if (pos != string::npos) {
                string t = remove_spaces(p.substr(old_pos, pos - old_pos));

                temp.push_back(t);

                old_pos = ++pos;
            }
        }

        if (pos != old_pos) {
            string t = remove_spaces(p.substr(old_pos, p.size() - old_pos));

            if (t != "") temp.push_back(t);
        }

        return temp;
    }